

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O1

void __thiscall
QCachedPainter::QCachedPainter
          (QCachedPainter *this,QPainter *painter,QString *cachePrefix,QStyleOption *option,
          QSize size,QRect paintRect)

{
  QSize QVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined1 *puVar4;
  bool bVar5;
  uint uVar6;
  undefined4 uVar7;
  ulong uVar8;
  QPainter *pQVar9;
  pointer __p;
  ulong uVar10;
  QPixmap *this_00;
  long in_FS_OFFSET;
  qreal dpr;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  QPixmap cachePixmap;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QSize local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_painter = painter;
  this->m_option = option;
  this_00 = &this->m_pixmap;
  (this->m_pixmapPainter)._M_t.super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
  super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
  super__Head_base<0UL,_QPainter_*,_false>._M_head_impl = (QPainter *)0x0;
  (this->m_pixmapName).d.d = (Data *)0x0;
  (this->m_pixmapName).d.ptr = (char16_t *)0x0;
  (this->m_pixmapName).d.size = 0;
  QPixmap::QPixmap(this_00);
  (this->m_paintRect).x1 = (Representation)paintRect.x1.m_i;
  (this->m_paintRect).y1 = (Representation)paintRect.y1.m_i;
  (this->m_paintRect).x2 = (Representation)paintRect.x2.m_i;
  (this->m_paintRect).y2 = (Representation)paintRect.y2.m_i;
  this->m_pixmapDrawn = false;
  if (size.ht.m_i.m_i < 1 || size.wd.m_i.m_i < 1) {
    size.wd.m_i = ((option->rect).x2.m_i - (option->rect).x1.m_i) + 1;
    size.ht.m_i = ((option->rect).y2.m_i - (option->rect).y1.m_i) + 1;
  }
  local_60 = size;
  QPainter::device();
  dpr = (qreal)QPaintDevice::devicePixelRatio();
  QStyleHelper::uniqueName(&local_58,cachePrefix,option,&local_60,dpr);
  QVar1 = (QSize)(this->m_pixmapName).d.d;
  pcVar2 = (this->m_pixmapName).d.ptr;
  (this->m_pixmapName).d.d = local_58.d.d;
  (this->m_pixmapName).d.ptr = local_58.d.ptr;
  qVar3 = (this->m_pixmapName).d.size;
  (this->m_pixmapName).d.size = local_58.d.size;
  local_58.d.d = (Data *)QVar1;
  local_58.d.ptr = pcVar2;
  local_58.d.size = qVar3;
  if (QVar1 != (QSize)0x0) {
    LOCK();
    *(int *)QVar1 = *(int *)QVar1 + -1;
    UNLOCK();
    if (*(int *)QVar1 == 0) {
      QArrayData::deallocate((QArrayData *)QVar1,2,0x10);
    }
  }
  bVar5 = (bool)QPixmapCache::find((QString *)&this->m_pixmapName,this_00);
  this->m_alreadyCached = bVar5;
  if (bVar5 == false) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    dVar12 = dpr * (double)local_60.wd.m_i.m_i;
    dVar14 = dpr * (double)local_60.ht.m_i.m_i;
    auVar13._0_8_ = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
    auVar13._8_8_ = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
    auVar13 = minpd(_DAT_0066f5d0,auVar13);
    auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
    auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
    uVar6 = movmskpd((int)&this->m_pixmapPainter,auVar11);
    uVar10 = 0x8000000000000000;
    if ((uVar6 & 2) != 0) {
      uVar10 = (ulong)(uint)(int)auVar13._8_8_ << 0x20;
    }
    uVar8 = 0x80000000;
    if ((uVar6 & 1) != 0) {
      uVar8 = (ulong)(uint)(int)auVar13._0_8_;
    }
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)(uVar8 | uVar10);
    QPixmap::QPixmap((QPixmap *)&local_78,(QSize *)&local_58);
    QPixmap::setDevicePixelRatio(dpr);
    QColor::QColor((QColor *)&local_58,transparent);
    QPixmap::fill((QColor *)&local_78);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    puVar4 = local_68;
    local_58.d.d = (Data *)QDataStream::operator<<;
    local_68 = (undefined1 *)0x0;
    local_58.d.size = *(qsizetype *)&this->field_0x40;
    *(undefined1 **)&this->field_0x40 = puVar4;
    QPixmap::~QPixmap((QPixmap *)&local_58);
    QPixmap::~QPixmap((QPixmap *)&local_78);
    pQVar9 = (QPainter *)operator_new(8);
    QPainter::QPainter(pQVar9,(QPaintDevice *)this_00);
    local_58.d.d = (Data *)0x0;
    std::__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>::reset
              ((__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_> *)&this->m_pixmapPainter,
               pQVar9);
    std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::~unique_ptr
              ((unique_ptr<QPainter,_std::default_delete<QPainter>_> *)&local_58);
    pQVar9 = (this->m_pixmapPainter)._M_t.
             super___uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>._M_t.
             super__Tuple_impl<0UL,_QPainter_*,_std::default_delete<QPainter>_>.
             super__Head_base<0UL,_QPainter_*,_false>._M_head_impl;
    uVar7 = QPainter::renderHints();
    QPainter::setRenderHints(pQVar9,uVar7,1);
    QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QString,QHashDummyValue> *)&s_pixmapCacheKeys,&this->m_pixmapName,
               (QHashDummyValue *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCachedPainter::QCachedPainter(QPainter *painter, const QString &cachePrefix,
                               const QStyleOption *option, QSize size, QRect paintRect)
    : m_painter(painter)
    , m_option(option)
    , m_paintRect(paintRect)
{
    const auto sz = size.isEmpty() ? option->rect.size() : size;
    const qreal dpr = QStyleHelper::getDpr(painter);
    m_pixmapName = QStyleHelper::uniqueName(cachePrefix, option, sz, dpr);
    m_alreadyCached = QPixmapCache::find(m_pixmapName, &m_pixmap);
    if (!m_alreadyCached) {
        m_pixmap = styleCachePixmap(sz, dpr);
        m_pixmapPainter = std::make_unique<QPainter>(&m_pixmap);
        m_pixmapPainter->setRenderHints(painter->renderHints());
        s_pixmapCacheKeys += m_pixmapName;
    }
}